

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_combo_callback(nk_context *ctx,_func_void_void_ptr_int_char_ptr_ptr *item_getter,
                     void *userdata,int selected,int count,int item_height,nk_vec2 size)

{
  int iVar1;
  float local_6c;
  char *local_60;
  char *item;
  nk_vec2 window_padding;
  nk_vec2 item_spacing;
  int local_40;
  int max_height;
  int i;
  int item_height_local;
  int count_local;
  int selected_local;
  void *userdata_local;
  _func_void_void_ptr_int_char_ptr_ptr *item_getter_local;
  nk_context *ctx_local;
  float fStack_10;
  nk_vec2 size_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x61c3,
                  "int nk_combo_callback(struct nk_context *, void (*)(void *, int, const char **), void *, int, int, int, struct nk_vec2)"
                 );
  }
  if (item_getter == (_func_void_void_ptr_int_char_ptr_ptr *)0x0) {
    __assert_fail("item_getter",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x61c4,
                  "int nk_combo_callback(struct nk_context *, void (*)(void *, int, const char **), void *, int, int, int, struct nk_vec2)"
                 );
  }
  size_local.x = (float)selected;
  if ((ctx != (nk_context *)0x0) && (item_getter != (_func_void_void_ptr_int_char_ptr_ptr *)0x0)) {
    window_padding = (ctx->style).window.spacing;
    item = (char *)nk_panel_get_padding(&ctx->style,ctx->current->layout->type);
    iVar1 = (int)window_padding.y * 2 + (int)item._4_4_ * 2 +
            count * item_height + count * (int)window_padding.y;
    fStack_10 = size.y;
    if ((float)iVar1 <= fStack_10) {
      local_6c = (float)iVar1;
    }
    else {
      local_6c = fStack_10;
    }
    ctx_local._4_4_ = size.x;
    fStack_10 = local_6c;
    (*item_getter)(userdata,selected,&local_60);
    iVar1 = nk_combo_begin_label(ctx,local_60,stack0xffffffffffffffec);
    item_height_local = selected;
    if (iVar1 != 0) {
      nk_layout_row_dynamic(ctx,(float)item_height,1);
      for (local_40 = 0; local_40 < count; local_40 = local_40 + 1) {
        (*item_getter)(userdata,local_40,&local_60);
        iVar1 = nk_combo_item_label(ctx,local_60,0x11);
        if (iVar1 != 0) {
          item_height_local = local_40;
        }
      }
      nk_combo_end(ctx);
    }
    size_local.x = (float)item_height_local;
  }
  return (int)size_local.x;
}

Assistant:

NK_API int
nk_combo_callback(struct nk_context *ctx, void(*item_getter)(void*, int, const char**),
    void *userdata, int selected, int count, int item_height, struct nk_vec2 size)
{
    int i;
    int max_height;
    struct nk_vec2 item_spacing;
    struct nk_vec2 window_padding;
    const char *item;

    NK_ASSERT(ctx);
    NK_ASSERT(item_getter);
    if (!ctx || !item_getter)
        return selected;

    /* calculate popup window */
    item_spacing = ctx->style.window.spacing;
    window_padding = nk_panel_get_padding(&ctx->style, ctx->current->layout->type);
    max_height = count * item_height + count * (int)item_spacing.y;
    max_height += (int)item_spacing.y * 2 + (int)window_padding.y * 2;
    size.y = NK_MIN(size.y, (float)max_height);

    item_getter(userdata, selected, &item);
    if (nk_combo_begin_label(ctx, item, size)) {
        nk_layout_row_dynamic(ctx, (float)item_height, 1);
        for (i = 0; i < count; ++i) {
            item_getter(userdata, i, &item);
            if (nk_combo_item_label(ctx, item, NK_TEXT_LEFT))
                selected = i;
        }
        nk_combo_end(ctx);
    } return selected;
}